

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::ArgMinMaxState<duckdb::hugeint_t,double>,duckdb::hugeint_t,double,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
               (hugeint_t *adata,AggregateInputData *aggr_input_data,double *bdata,
               ArgMinMaxState<duckdb::hugeint_t,_double> **states,idx_t count,SelectionVector *asel,
               SelectionVector *bsel,SelectionVector *ssel,ValidityMask *avalidity,
               ValidityMask *bvalidity)

{
  ulong uVar1;
  idx_t i;
  ulong uVar2;
  AggregateBinaryInput *binary;
  AggregateInputData *local_58;
  ValidityMask *local_50;
  ValidityMask *pVStack_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = avalidity;
  pVStack_48 = bvalidity;
  binary = (AggregateBinaryInput *)count;
  local_58 = aggr_input_data;
  for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
    local_40 = uVar2;
    if (asel->sel_vector != (sel_t *)0x0) {
      local_40 = (ulong)asel->sel_vector[uVar2];
    }
    local_38 = uVar2;
    if (bsel->sel_vector != (sel_t *)0x0) {
      local_38 = (ulong)bsel->sel_vector[uVar2];
    }
    uVar1 = uVar2;
    if (ssel->sel_vector != (sel_t *)0x0) {
      uVar1 = (ulong)ssel->sel_vector[uVar2];
    }
    ArgMinMaxBase<duckdb::GreaterThan,false>::
    Operation<duckdb::hugeint_t,double,duckdb::ArgMinMaxState<duckdb::hugeint_t,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
              ((ArgMinMaxBase<duckdb::GreaterThan,false> *)states[uVar1],
               (ArgMinMaxState<duckdb::hugeint_t,_double> *)(adata + local_40),
               (hugeint_t *)(bdata + local_38),(double *)&local_58,binary);
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}